

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaybeRemovedValue.hpp
# Opt level: O1

MaybeRemovedValue<supermap::ByteArray<1UL>_> __thiscall
supermap::io::DeserializeHelper<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_void>::
deserialize(DeserializeHelper<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_void> *this,
           istream *is)

{
  undefined8 in_RAX;
  undefined8 extraout_RDX;
  pointer *__ptr;
  MaybeRemovedValue<supermap::ByteArray<1UL>_> MVar1;
  bool obj;
  DeserializeHelper<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_void> local_11;
  
  local_11 = SUB81((ulong)in_RAX >> 0x38,0);
  DeserializeHelper<supermap::ByteArray<1UL>,_void>::deserialize
            ((DeserializeHelper<supermap::ByteArray<1UL>,_void> *)this,is);
  std::istream::read((char *)is,(long)&local_11);
  this[8] = local_11;
  MVar1._8_8_ = extraout_RDX;
  MVar1.value.data_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)this;
  return MVar1;
}

Assistant:

static MaybeRemovedValue<T> deserialize(std::istream &is) {
        return {
            io::deserialize<T>(is),
            io::deserialize<bool>(is)
        };
    }